

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

void Bmcs_ManPrintTime(Bmcs_Man_t *p)

{
  long lVar1;
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  double local_28;
  abctime clkTotal;
  Bmcs_Man_t *p_local;
  
  lVar1 = p->timeUnf + p->timeCnf + p->timeSat + p->timeOth;
  if (p->pPars->fVerbose != 0) {
    Abc_Print(1,"%s =","Unfolding     ");
    if (((double)lVar1 != 0.0) || (NAN((double)lVar1))) {
      local_28 = ((double)p->timeUnf * 100.0) / (double)lVar1;
    }
    else {
      local_28 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeUnf * 1.0) / 1000000.0,local_28);
    Abc_Print(1,"%s =","CNF generation");
    if (((double)lVar1 != 0.0) || (NAN((double)lVar1))) {
      local_38 = ((double)p->timeCnf * 100.0) / (double)lVar1;
    }
    else {
      local_38 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCnf * 1.0) / 1000000.0,local_38);
    Abc_Print(1,"%s =","SAT solving   ");
    if (((double)lVar1 != 0.0) || (NAN((double)lVar1))) {
      local_48 = ((double)p->timeSat * 100.0) / (double)lVar1;
    }
    else {
      local_48 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSat * 1.0) / 1000000.0,local_48);
    Abc_Print(1,"%s =","Other         ");
    if (((double)lVar1 != 0.0) || (NAN((double)lVar1))) {
      local_58 = ((double)p->timeOth * 100.0) / (double)lVar1;
    }
    else {
      local_58 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOth * 1.0) / 1000000.0,local_58);
    Abc_Print(1,"%s =","TOTAL         ");
    if (((double)lVar1 != 0.0) || (NAN((double)lVar1))) {
      local_68 = ((double)lVar1 * 100.0) / (double)lVar1;
    }
    else {
      local_68 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar1 * 1.0) / 1000000.0,local_68);
  }
  return;
}

Assistant:

void Bmcs_ManPrintTime( Bmcs_Man_t * p )
{
    abctime clkTotal = p->timeUnf + p->timeCnf + p->timeSat + p->timeOth;
    if ( !p->pPars->fVerbose )
        return;
    ABC_PRTP( "Unfolding     ", p->timeUnf,  clkTotal );
    ABC_PRTP( "CNF generation", p->timeCnf,  clkTotal );
    ABC_PRTP( "SAT solving   ", p->timeSat,  clkTotal );
    ABC_PRTP( "Other         ", p->timeOth,  clkTotal );
    ABC_PRTP( "TOTAL         ", clkTotal  ,  clkTotal );
}